

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unary.cpp
# Opt level: O2

string * __thiscall
DragonParser::InterNamespace::Unary::to_string_abi_cxx11_
          (string *__return_storage_ptr__,Unary *this)

{
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  LexerNamespace::Token::to_string_abi_cxx11_(&local_38,&(this->super_Op).super_Expr.op);
  std::operator+(&local_58,&local_38," ");
  Expr::to_string_abi_cxx11_(&sStack_78,&this->expr);
  std::operator+(__return_storage_ptr__,&local_58,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string Unary::to_string() const {
        return op.to_string() + " " + expr.to_string();
    }